

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_match.c
# Opt level: O0

int match_ref(size_t offset,size_t offset_top,PCRE2_SPTR8 eptr,match_block_8 *mb,BOOL caseless,
             size_t *lengthptr)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  pcre2_memctl *ppVar4;
  PCRE2_SPTR8 pPVar5;
  match_block_8 *pmVar6;
  byte *pbVar7;
  uint32_t cp;
  uint32_t cc;
  uint32_t *pp;
  ucd_record *ur;
  uint32_t d;
  uint32_t c;
  PCRE2_SPTR8 endptr;
  PCRE2_SPTR8 eptr_start;
  size_t length;
  PCRE2_SPTR8 p;
  BOOL utf;
  size_t *lengthptr_local;
  BOOL caseless_local;
  match_block_8 *mb_local;
  PCRE2_SPTR8 eptr_local;
  size_t offset_top_local;
  size_t offset_local;
  
  if ((offset < offset_top) && (mb->ovector[offset] != 0xffffffffffffffff)) {
    length = (size_t)(mb->start_subject + mb->ovector[offset]);
    eptr_start = (PCRE2_SPTR8)(mb->ovector[offset + 1] - mb->ovector[offset]);
    mb_local = (match_block_8 *)eptr;
    if (caseless == 0) {
      do {
        if (eptr_start == (PCRE2_SPTR8)0x0) goto LAB_00133581;
        if ((match_block_8 *)mb->end_subject <= mb_local) {
          return 1;
        }
        cVar3 = *(char *)length;
        ppVar4 = &mb_local->memctl;
        eptr_start = eptr_start + -1;
        length = length + 1;
        mb_local = (match_block_8 *)((long)&(mb_local->memctl).malloc + 1);
      } while (cVar3 == *(char *)&ppVar4->malloc);
      offset_local._4_4_ = -1;
    }
    else {
      mb_local = (match_block_8 *)eptr;
      if ((mb->poptions & 0x80000) == 0) {
        while (eptr_start != (PCRE2_SPTR8)0x0) {
          if ((match_block_8 *)mb->end_subject <= mb_local) {
            return 1;
          }
          if (mb->lcc[*(byte *)length] != mb->lcc[*(byte *)&(mb_local->memctl).malloc]) {
            return -1;
          }
          length = length + 1;
          mb_local = (match_block_8 *)((long)&(mb_local->memctl).malloc + 1);
          eptr_start = eptr_start + -1;
        }
      }
      else {
        pPVar5 = (PCRE2_SPTR8)(length + (long)eptr_start);
        while (length < pPVar5) {
          if ((match_block_8 *)mb->end_subject <= mb_local) {
            return 1;
          }
          pmVar6 = (match_block_8 *)((long)&(mb_local->memctl).malloc + 1);
          bVar2 = *(byte *)&(mb_local->memctl).malloc;
          ur._4_4_ = (uint)bVar2;
          if (0xbf < ur._4_4_) {
            if ((bVar2 & 0x20) == 0) {
              ur._4_4_ = (ur._4_4_ & 0x1f) << 6 | *(byte *)&(pmVar6->memctl).malloc & 0x3f;
              pmVar6 = (match_block_8 *)((long)&(mb_local->memctl).malloc + 2);
            }
            else if ((bVar2 & 0x10) == 0) {
              ur._4_4_ = (ur._4_4_ & 0xf) << 0xc | (*(byte *)&(pmVar6->memctl).malloc & 0x3f) << 6 |
                         *(byte *)((long)&(mb_local->memctl).malloc + 2) & 0x3f;
              pmVar6 = (match_block_8 *)((long)&(mb_local->memctl).malloc + 3);
            }
            else if ((bVar2 & 8) == 0) {
              ur._4_4_ = (ur._4_4_ & 7) << 0x12 | (*(byte *)&(pmVar6->memctl).malloc & 0x3f) << 0xc
                         | (*(byte *)((long)&(mb_local->memctl).malloc + 2) & 0x3f) << 6 |
                         *(byte *)((long)&(mb_local->memctl).malloc + 3) & 0x3f;
              pmVar6 = (match_block_8 *)((long)&(mb_local->memctl).malloc + 4);
            }
            else if ((bVar2 & 4) == 0) {
              ur._4_4_ = (ur._4_4_ & 3) << 0x18 | (*(byte *)&(pmVar6->memctl).malloc & 0x3f) << 0x12
                         | (*(byte *)((long)&(mb_local->memctl).malloc + 2) & 0x3f) << 0xc |
                         (*(byte *)((long)&(mb_local->memctl).malloc + 3) & 0x3f) << 6 |
                         *(byte *)((long)&(mb_local->memctl).malloc + 4) & 0x3f;
              pmVar6 = (match_block_8 *)((long)&(mb_local->memctl).malloc + 5);
            }
            else {
              ur._4_4_ = (ur._4_4_ & 1) << 0x1e | (*(byte *)&(pmVar6->memctl).malloc & 0x3f) << 0x18
                         | (*(byte *)((long)&(mb_local->memctl).malloc + 2) & 0x3f) << 0x12 |
                         (*(byte *)((long)&(mb_local->memctl).malloc + 3) & 0x3f) << 0xc |
                         (*(byte *)((long)&(mb_local->memctl).malloc + 4) & 0x3f) << 6 |
                         *(byte *)((long)&(mb_local->memctl).malloc + 5) & 0x3f;
              pmVar6 = (match_block_8 *)((long)&(mb_local->memctl).malloc + 6);
            }
          }
          mb_local = pmVar6;
          pbVar7 = (byte *)(length + 1);
          bVar2 = *(byte *)length;
          ur._0_4_ = (uint)bVar2;
          if (0xbf < (uint)ur) {
            if ((bVar2 & 0x20) == 0) {
              ur._0_4_ = ((uint)ur & 0x1f) << 6 | *pbVar7 & 0x3f;
              pbVar7 = (byte *)(length + 2);
            }
            else if ((bVar2 & 0x10) == 0) {
              ur._0_4_ = ((uint)ur & 0xf) << 0xc | (*pbVar7 & 0x3f) << 6 |
                         *(byte *)(length + 2) & 0x3f;
              pbVar7 = (byte *)(length + 3);
            }
            else if ((bVar2 & 8) == 0) {
              ur._0_4_ = ((uint)ur & 7) << 0x12 | (*pbVar7 & 0x3f) << 0xc |
                         (*(byte *)(length + 2) & 0x3f) << 6 | *(byte *)(length + 3) & 0x3f;
              pbVar7 = (byte *)(length + 4);
            }
            else if ((bVar2 & 4) == 0) {
              ur._0_4_ = ((uint)ur & 3) << 0x18 | (*pbVar7 & 0x3f) << 0x12 |
                         (*(byte *)(length + 2) & 0x3f) << 0xc | (*(byte *)(length + 3) & 0x3f) << 6
                         | *(byte *)(length + 4) & 0x3f;
              pbVar7 = (byte *)(length + 5);
            }
            else {
              ur._0_4_ = ((uint)ur & 1) << 0x1e | (*pbVar7 & 0x3f) << 0x18 |
                         (*(byte *)(length + 2) & 0x3f) << 0x12 |
                         (*(byte *)(length + 3) & 0x3f) << 0xc | (*(byte *)(length + 4) & 0x3f) << 6
                         | *(byte *)(length + 5) & 0x3f;
              pbVar7 = (byte *)(length + 6);
            }
          }
          length = (size_t)pbVar7;
          if ((ur._4_4_ != (uint)ur) &&
             (ur._4_4_ !=
              (uint)ur +
              _pcre2_ucd_records_8
              [(int)(uint)_pcre2_ucd_stage2_8
                          [(int)((uint)""[(int)((uint)ur / 0x80)] * 0x80 + (uint)ur % 0x80)]].
              other_case)) {
            _cp = _pcre2_ucd_caseless_sets_8 +
                  (int)(uint)_pcre2_ucd_records_8
                             [(int)(uint)_pcre2_ucd_stage2_8
                                         [(int)((uint)""[(int)((uint)ur / 0x80)] * 0x80 +
                                               (uint)ur % 0x80)]].caseset;
            do {
              if (ur._4_4_ < *_cp) {
                return -1;
              }
              uVar1 = *_cp;
              _cp = _cp + 1;
            } while (ur._4_4_ != uVar1);
          }
        }
      }
LAB_00133581:
      *lengthptr = (long)mb_local - (long)eptr;
      offset_local._4_4_ = 0;
    }
  }
  else if ((mb->poptions & 0x200) == 0) {
    offset_local._4_4_ = -1;
  }
  else {
    *lengthptr = 0;
    offset_local._4_4_ = 0;
  }
  return offset_local._4_4_;
}

Assistant:

static int
match_ref(PCRE2_SIZE offset, PCRE2_SIZE offset_top, register PCRE2_SPTR eptr,
  match_block *mb, BOOL caseless, PCRE2_SIZE *lengthptr)
{
#if defined SUPPORT_UNICODE
BOOL utf = (mb->poptions & PCRE2_UTF) != 0;
#endif

register PCRE2_SPTR p;
PCRE2_SIZE length;
PCRE2_SPTR eptr_start = eptr;

/* Deal with an unset group. The default is no match, but there is an option to
match an empty string. */

if (offset >= offset_top || mb->ovector[offset] == PCRE2_UNSET)
  {
  if ((mb->poptions & PCRE2_MATCH_UNSET_BACKREF) != 0)
    {
    *lengthptr = 0;
    return 0;      /* Match */
    }
  else return -1;  /* No match */
  }

/* Separate the caseless and UTF cases for speed. */

p = mb->start_subject + mb->ovector[offset];
length = mb->ovector[offset+1] - mb->ovector[offset];

if (caseless)
  {
#if defined SUPPORT_UNICODE
  if (utf)
    {
    /* Match characters up to the end of the reference. NOTE: the number of
    code units matched may differ, because in UTF-8 there are some characters
    whose upper and lower case versions code have different numbers of bytes.
    For example, U+023A (2 bytes in UTF-8) is the upper case version of U+2C65
    (3 bytes in UTF-8); a sequence of 3 of the former uses 6 bytes, as does a
    sequence of two of the latter. It is important, therefore, to check the
    length along the reference, not along the subject (earlier code did this
    wrong). */

    PCRE2_SPTR endptr = p + length;
    while (p < endptr)
      {
      uint32_t c, d;
      const ucd_record *ur;
      if (eptr >= mb->end_subject) return 1;   /* Partial match */
      GETCHARINC(c, eptr);
      GETCHARINC(d, p);
      ur = GET_UCD(d);
      if (c != d && c != d + ur->other_case)
        {
        const uint32_t *pp = PRIV(ucd_caseless_sets) + ur->caseset;
        for (;;)
          {
          if (c < *pp) return -1;  /* No match */
          if (c == *pp++) break;
          }
        }
      }
    }
  else
#endif

    /* Not in UTF mode */

    {
    while (length-- > 0)
      {
      uint32_t cc, cp;
      if (eptr >= mb->end_subject) return 1;   /* Partial match */
      cc = UCHAR21TEST(eptr);
      cp = UCHAR21TEST(p);
      if (TABLE_GET(cp, mb->lcc, cp) != TABLE_GET(cc, mb->lcc, cc))
        return -1;  /* No match */
      p++;
      eptr++;
      }
    }
  }

/* In the caseful case, we can just compare the code units, whether or not we
are in UT mode. */

else
  {
  while (length-- > 0)
    {
    if (eptr >= mb->end_subject) return 1;   /* Partial match */
    if (UCHAR21INCTEST(p) != UCHAR21INCTEST(eptr)) return -1;  /*No match */
    }
  }

*lengthptr = eptr - eptr_start;
return 0;  /* Match */
}